

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.cpp
# Opt level: O2

void __thiscall Refal2::CQualifier::printChars(CQualifier *this,ostream *outputStream)

{
  CAnsiSet *__x;
  CFastSet<char> *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  char *pcVar7;
  int i;
  size_t __position;
  allocator local_b1;
  CAnsiSet other;
  set<char,_std::less<char>,_std::allocator<char>_> a;
  CAnsiSet D;
  CAnsiSet L;
  _Base_bitset<2UL> local_40;
  
  __x = &this->ansichars;
  L.super__Base_bitset<2UL>._M_w =
       (_Base_bitset<2UL>)std::operator&(__x,(bitset<128UL> *)CQualifierBuilder::AnsiL);
  D.super__Base_bitset<2UL>._M_w =
       (_Base_bitset<2UL>)std::operator&(__x,(bitset<128UL> *)CQualifierBuilder::AnsiD);
  std::__cxx11::string::string((string *)&a,CQualifierBuilder::Alphabet,(allocator *)&local_40);
  std::__cxx11::string::string((string *)&other,"L",&local_b1);
  printAnsiSet(outputStream,&L,(string *)&a,(string *)&other);
  std::__cxx11::string::~string((string *)&other);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string((string *)&a,CQualifierBuilder::Numbers,(allocator *)&local_40);
  std::__cxx11::string::string((string *)&other,"D",&local_b1);
  printAnsiSet(outputStream,&D,(string *)&a,(string *)&other);
  std::__cxx11::string::~string((string *)&other);
  std::__cxx11::string::~string((string *)&a);
  local_40._M_w = (_WordT  [2])std::operator|(&L,&D);
  a._M_t._M_impl._0_16_ = std::bitset<128UL>::operator~((bitset<128UL> *)&local_40);
  other.super__Base_bitset<2UL>._M_w = (_Base_bitset<2UL>)std::operator&(__x,(bitset<128UL> *)&a);
  sVar5 = std::_Base_bitset<2UL>::_M_do_count(&other.super__Base_bitset<2UL>);
  if (0x1e < sVar5) {
    a._M_t._M_impl._0_16_ =
         std::operator|((bitset<128UL> *)CQualifierBuilder::AnsiL,
                        (bitset<128UL> *)CQualifierBuilder::AnsiD);
    std::_Base_bitset<2UL>::_M_do_or(&other.super__Base_bitset<2UL>,(_Base_bitset<2UL> *)&a);
    std::operator<<(outputStream,"(");
  }
  std::operator<<(outputStream,"\'");
  for (__position = 1; __position != 0x80; __position = __position + 1) {
    bVar2 = std::bitset<128UL>::test(&other,__position);
    if (bVar2 == sVar5 < 0x1f) {
      std::operator<<(outputStream,(char)__position);
    }
  }
  std::operator<<(outputStream,"\' ");
  if (0x1e < sVar5) {
    std::operator<<(outputStream,")");
  }
  this_00 = &this->chars;
  iVar3 = (this->chars).elementsSize;
  if (iVar3 != 0 && (this->flags & 2) != 0) {
    std::operator<<(outputStream,"(");
    iVar3 = this_00->elementsSize;
  }
  if (iVar3 != 0) {
    std::operator<<(outputStream,"\'");
  }
  p_Var1 = &a._M_t._M_impl.super__Rb_tree_header;
  a._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  a._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  a._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  a._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  a._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  CFastSet<char>::GetSet(this_00,&a);
  for (p_Var6 = a._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::operator<<(outputStream,(char)p_Var6[1]._M_color);
  }
  if (this_00->elementsSize == 0) {
    bVar2 = true;
  }
  else {
    std::operator<<(outputStream,"\'");
    bVar2 = this_00->elementsSize == 0;
  }
  uVar4 = this->flags;
  if (((uVar4 & 2) != 0) && (!bVar2)) {
    std::operator<<(outputStream,") ");
    uVar4 = this->flags;
  }
  pcVar7 = "O ";
  if ((uVar4 & 2) == 0) {
    pcVar7 = "(O) ";
  }
  std::operator<<(outputStream,pcVar7);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&a._M_t);
  return;
}

Assistant:

void CQualifier::printChars( std::ostream& outputStream ) const
{
	CAnsiSet L = ansichars & CQualifierBuilder::AnsiL;
	CAnsiSet D = ansichars & CQualifierBuilder::AnsiD;

	printAnsiSet( outputStream, L, CQualifierBuilder::Alphabet, "L" );
	printAnsiSet( outputStream, D, CQualifierBuilder::Numbers, "D" );

	CAnsiSet other = ansichars & ~(L | D);
	bool superFlag = other.count() < 31;
	if( !superFlag ) {
		other |= CQualifierBuilder::AnsiL | CQualifierBuilder::AnsiD;
		outputStream << "(";
	}
	outputStream << "'";
	for( int i = 1; i < AnsiSetSize; i++ ) {
		if( other.test( i ) == superFlag ) {
			outputStream << static_cast<char>( i );
		}
	}
	outputStream << "' ";
	if( !superFlag ) {
		outputStream << ")";
	}

	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << "(";
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	std::set<TChar> a;
	chars.GetSet( &a );
	for( std::set<TChar>::const_iterator i = a.begin(); i != a.end(); ++i ) {
		outputStream << *i;
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << ") ";
	}

	if( IsIncludeAllChars() ) {
		outputStream << "O ";
	} else {
		outputStream << "(O) ";
	}
}